

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testCenter<Imath_2_5::Vec4<float>>(char *type)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  float *pfVar6;
  char *in_RDI;
  Box<Imath_2_5::Vec4<float>_> b_1;
  Vec4<float> max;
  Vec4<float> min;
  Box<Imath_2_5::Vec4<float>_> b1;
  uint i;
  Vec4<float> p1;
  Vec4<float> p0;
  Box<Imath_2_5::Vec4<float>_> b0;
  Box<Imath_2_5::Vec4<float>_> b;
  undefined4 in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe84;
  Vec4<float> *in_stack_fffffffffffffe88;
  Box<Imath_2_5::Vec4<float>_> *in_stack_fffffffffffffe90;
  Box<Imath_2_5::Vec4<float>_> *in_stack_fffffffffffffe98;
  Vec4<float> local_13c;
  Vec4<float> local_12c [2];
  Vec4<float> local_10c;
  Vec4<float> local_fc [3];
  uint local_cc;
  Vec4<float> local_c8;
  Vec4<float> local_b8;
  Vec4<float> local_a8;
  Vec4<float> local_98;
  Vec4<float> local_88;
  Vec4<float> local_78 [3];
  Vec4<float> local_48;
  Vec4<float> local_38 [3];
  char *local_8;
  
  local_8 = in_RDI;
  poVar5 = std::operator<<((ostream *)&std::cout,"    center() for type ");
  poVar5 = std::operator<<(poVar5,local_8);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Box<Imath_2_5::Vec4<float>_>::Box
            ((Box<Imath_2_5::Vec4<float>_> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  Imath_2_5::Box<Imath_2_5::Vec4<float>_>::center(in_stack_fffffffffffffe98);
  Imath_2_5::Vec4<float>::Vec4(&local_48,0.0);
  bVar2 = Imath_2_5::Vec4<float>::operator==(local_38,&local_48);
  if (!bVar2) {
    __assert_fail("b.center() == T(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x2ab,
                  "void (anonymous namespace)::testCenter(const char *) [T = Imath_2_5::Vec4<float>]"
                 );
  }
  Imath_2_5::Vec4<float>::Vec4(local_78,-1.0);
  Imath_2_5::Vec4<float>::Vec4(&local_88,1.0);
  Imath_2_5::Box<Imath_2_5::Vec4<float>_>::Box
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (Vec4<float> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  Imath_2_5::Box<Imath_2_5::Vec4<float>_>::center(in_stack_fffffffffffffe98);
  Imath_2_5::Vec4<float>::Vec4(&local_a8,0.0);
  bVar2 = Imath_2_5::Vec4<float>::operator==(&local_98,&local_a8);
  if (!bVar2) {
    __assert_fail("b0.center() == T(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x2bd,
                  "void (anonymous namespace)::testCenter(const char *) [T = Imath_2_5::Vec4<float>]"
                 );
  }
  Imath_2_5::Vec4<float>::Vec4(&local_b8);
  Imath_2_5::Vec4<float>::Vec4(&local_c8);
  local_cc = 0;
  while( true ) {
    uVar4 = local_cc;
    uVar3 = Imath_2_5::Vec4<float>::dimensions();
    if (uVar3 <= uVar4) break;
    cVar1 = (char)local_cc;
    pfVar6 = Imath_2_5::Vec4<float>::operator[](&local_b8,local_cc);
    *pfVar6 = -(float)(1 << (cVar1 + 1U & 0x1f));
    uVar4 = Imath_2_5::Vec4<float>::dimensions();
    cVar1 = (char)local_cc;
    pfVar6 = Imath_2_5::Vec4<float>::operator[](&local_c8,local_cc);
    *pfVar6 = (float)(1 << ((char)uVar4 - cVar1 & 0x1fU));
    local_cc = local_cc + 1;
  }
  Imath_2_5::Box<Imath_2_5::Vec4<float>_>::Box
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (Vec4<float> *)CONCAT44(in_stack_fffffffffffffe84,uVar4));
  Imath_2_5::Box<Imath_2_5::Vec4<float>_>::center(in_stack_fffffffffffffe98);
  Imath_2_5::Vec4<float>::operator+
            (in_stack_fffffffffffffe88,(Vec4<float> *)CONCAT44(in_stack_fffffffffffffe84,uVar4));
  Imath_2_5::Vec4<float>::operator/(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
  bVar2 = Imath_2_5::Vec4<float>::operator==(local_fc,&local_10c);
  if (!bVar2) {
    __assert_fail("b1.center() == (p1 + p0) / 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x2c7,
                  "void (anonymous namespace)::testCenter(const char *) [T = Imath_2_5::Vec4<float>]"
                 );
  }
  Imath_2_5::Vec4<float>::Vec4(local_12c,0.0);
  Imath_2_5::Vec4<float>::Vec4(&local_13c,local_12c);
  uVar3 = Imath_2_5::Vec4<float>::dimensions();
  pfVar6 = Imath_2_5::Vec4<float>::operator[](&local_13c,uVar3 - 1);
  *pfVar6 = 2.0;
  Imath_2_5::Box<Imath_2_5::Vec4<float>_>::Box
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (Vec4<float> *)CONCAT44(in_stack_fffffffffffffe84,uVar4));
  Imath_2_5::Box<Imath_2_5::Vec4<float>_>::center(in_stack_fffffffffffffe98);
  Imath_2_5::Vec4<float>::operator/(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
  bVar2 = Imath_2_5::Vec4<float>::operator==
                    ((Vec4<float> *)&stack0xfffffffffffffe94,(Vec4<float> *)&stack0xfffffffffffffe84
                    );
  if (!bVar2) {
    __assert_fail("b.center() == max /2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x2d8,
                  "void (anonymous namespace)::testCenter(const char *) [T = Imath_2_5::Vec4<float>]"
                 );
  }
  return;
}

Assistant:

void
testCenter(const char *type)
{
    cout << "    center() for type " << type << endl;

    //
    // Center of empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert(b.center() == T(0));
    }

    //
    // Center of non-empty, has-volume box.
    // Boxes are:
    //    2D: [(-1, -1),         (1, 1)       ]
    //    3D: [(-1, -1, -1),     (1, 1, 1)    ]
    //    4D: [(-1, -1, -1, -1), (1, 1, 1, 1) ] 
    //
    // and
    //
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0(T(-1), T(1));
        assert(b0.center() == T(0));

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions(); i++)
        {
            p0[i] = -typename T::BaseType(1 << (i + 1));
            p1[i] =  typename T::BaseType(1 << (T::dimensions() - i));
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1(p0, p1);
        assert(b1.center() == (p1 + p0) / 2);
    }

    //
    // Center of non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min(0);
        T max = min;
        max[T::dimensions() - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b(min, max);

        assert(b.center() == max /2);
    }
}